

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O1

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createRealloc
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,CallInst *CInst)

{
  long lVar1;
  PSNodeAlloc *pPVar2;
  PSNode *n;
  PSNode *n_00;
  size_t sVar3;
  size_t sVar4;
  PSNodeAlloc *reall;
  PSNode *orig_mem;
  PSNodeAlloc *local_48;
  int local_3c;
  PSNode *local_38;
  
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->_repr = (PSNode *)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = getOperand(this,*(Value **)(CInst + -(ulong)(uint)(*(int *)(CInst + 0x14) << 5)));
  pPVar2 = (PSNodeAlloc *)PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)this);
  local_48 = (PSNodeAlloc *)0x0;
  if ((pPVar2->super_PSNode).type == ALLOC) {
    local_48 = pPVar2;
  }
  local_48->is_heap = true;
  (local_48->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.user_data = CInst;
  n = PointerGraph::
      create<(dg::pta::PSNodeType)20,dg::pta::PSNode*&,dg::pta::PSNodeAlloc*&,unsigned_long_const&>
                ((PointerGraph *)this,&local_38,&local_48,&Offset::UNKNOWN);
  local_3c = 0;
  n_00 = PointerGraph::create<(dg::pta::PSNodeType)18,dg::pta::PSNodeAlloc*&,int>
                   ((PointerGraph *)this,&local_48,&local_3c);
  pPVar2 = local_48;
  local_48->is_heap = true;
  lVar1 = *(long *)(CInst + (0x20 - (ulong)(uint)(*(int *)(CInst + 0x14) << 5)));
  sVar3 = Offset::UNKNOWN;
  if ((lVar1 != 0) && (*(char *)(lVar1 + 0x10) == '\x10')) {
    sVar3 = llvm::APInt::getLimitedValue((APInt *)(lVar1 + 0x18),0xffffffffffffffff);
  }
  sVar4 = 0;
  if (sVar3 != 0xffffffffffffffff) {
    sVar4 = sVar3;
  }
  (pPVar2->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.size = sVar4;
  PSNodesSeq::append(__return_storage_ptr__,&local_48->super_PSNode);
  PSNodesSeq::append(__return_storage_ptr__,n);
  PSNodesSeq::append(__return_storage_ptr__,n_00);
  __return_storage_ptr__->_repr = n_00;
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createRealloc(const llvm::CallInst *CInst) {
    using namespace llvm;

    PSNodesSeq ret;

    // we create new allocation node and memcpy old pointers there
    PSNode *orig_mem = getOperand(CInst->getOperand(0));
    PSNodeAlloc *reall = PSNodeAlloc::get(PS.create<PSNodeType::ALLOC>());
    reall->setIsHeap();
    reall->setUserData(const_cast<llvm::CallInst *>(CInst));

    // copy everything that is in orig_mem to reall
    PSNode *mcp =
            PS.create<PSNodeType::MEMCPY>(orig_mem, reall, Offset::UNKNOWN);
    // we need the pointer in the last node that we return
    PSNode *ptr = PS.create<PSNodeType::CONSTANT>(reall, 0);

    reall->setIsHeap();
    reall->setSize(llvmutils::getConstantSizeValue(CInst->getOperand(1)));

    ret.append(reall);
    ret.append(mcp);
    ret.append(ptr);
    ret.setRepresentant(ptr);

    return ret;
}